

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O3

void lj_gc_finalize_cdata(lua_State *L)

{
  global_State *g;
  uint64_t uVar1;
  bool bVar2;
  GCobj *o;
  long lVar3;
  long lVar4;
  uint64_t *puVar5;
  TValue tmp;
  cTValue local_38;
  
  g = (global_State *)(L->glref).ptr64;
  uVar1 = (g->ctype_state).ptr64;
  if (uVar1 != 0) {
    lVar3 = *(long *)(uVar1 + 0x20);
    *(undefined8 *)(lVar3 + 0x20) = 0;
    puVar5 = (uint64_t *)((ulong)*(uint *)(lVar3 + 0x34) * 0x18 + *(long *)(lVar3 + 0x28));
    lVar3 = (ulong)*(uint *)(lVar3 + 0x34) + 1;
    do {
      if ((*puVar5 != 0xffffffffffffffff) && ((uint)(puVar5[1] >> 0x2f) == 0x1fff5)) {
        o = (GCobj *)(puVar5[1] & 0x7fffffffffff);
        (o->gch).marked = (g->gc).currentwhite & 3 | (o->gch).marked & 0xe8;
        local_38.u64 = *puVar5;
        *puVar5 = 0xffffffffffffffff;
        gc_call_finalizer(g,L,&local_38,o);
      }
      puVar5 = puVar5 + -3;
      lVar4 = lVar3 + -1;
      bVar2 = 0 < lVar3;
      lVar3 = lVar4;
    } while (lVar4 != 0 && bVar2);
  }
  return;
}

Assistant:

void lj_gc_finalize_cdata(lua_State *L)
{
  global_State *g = G(L);
  CTState *cts = ctype_ctsG(g);
  if (cts) {
    GCtab *t = cts->finalizer;
    Node *node = noderef(t->node);
    ptrdiff_t i;
    setgcrefnull(t->metatable);  /* Mark finalizer table as disabled. */
    for (i = (ptrdiff_t)t->hmask; i >= 0; i--)
      if (!tvisnil(&node[i].val) && tviscdata(&node[i].key)) {
	GCobj *o = gcV(&node[i].key);
	TValue tmp;
	makewhite(g, o);
	o->gch.marked &= (uint8_t)~LJ_GC_CDATA_FIN;
	copyTV(L, &tmp, &node[i].val);
	setnilV(&node[i].val);
	gc_call_finalizer(g, L, &tmp, o);
      }
  }
}